

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval.h
# Opt level: O2

bool __thiscall
embree::sse2::PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
          (PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,Ref This,float *u,
          float *v,float dscale,size_t depth)

{
  undefined8 *puVar1;
  vfloat_impl<4> *pvVar2;
  vfloat_impl<4> *pvVar3;
  vfloat_impl<4> *pvVar4;
  vfloat_impl<4> *pvVar5;
  vfloat_impl<4> *pvVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined8 uVar38;
  undefined1 auVar39 [16];
  bool bVar40;
  uint uVar41;
  size_t i;
  float *pfVar42;
  long lVar43;
  vfloat_impl<4> *pvVar44;
  DynamicStackArray<float,_16UL,_64UL> *pDVar45;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *pDVar46;
  size_t *psVar47;
  ulong uVar48;
  Ref This_00;
  ulong uVar49;
  long lVar50;
  long lVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float t1_2;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar73;
  float fVar74;
  undefined1 auVar72 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar81;
  float fVar82;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float t1_4;
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar102;
  undefined1 auVar101 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float t1_1;
  float fVar108;
  float fVar109;
  float t1;
  float fVar110;
  float fVar111;
  float fVar112;
  CatmullClarkPatch patch;
  undefined8 local_e70;
  undefined8 uStack_e68;
  float local_e54;
  DynamicStackArray<float,_16UL,_64UL> *local_e50;
  undefined8 uStack_e48;
  float local_e40;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *local_e30;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *local_e20;
  undefined8 uStack_e18;
  size_t local_e10;
  PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *local_e00;
  float *local_df0;
  undefined8 uStack_de8;
  float *local_de0;
  FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> local_db0;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_d80;
  
  if (This.ptr == 0) {
    return false;
  }
  bVar40 = false;
  switch((uint)This.ptr & 0xf) {
  case 1:
    pfVar42 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar85 = *u;
    fVar83 = *v;
    pvVar44 = this->P;
    pvVar2 = this->dPdu;
    pvVar3 = this->dPdv;
    pvVar4 = this->ddPdudu;
    pvVar5 = this->ddPdvdv;
    pvVar6 = this->ddPdudv;
    if (pvVar44 != (vfloat_impl<4> *)0x0) {
      fVar75 = pfVar42[9];
      fVar93 = pfVar42[10];
      fVar64 = pfVar42[0xb];
      fVar58 = pfVar42[0xd];
      fVar67 = pfVar42[0xe];
      fVar68 = pfVar42[0xf];
      fVar69 = (pfVar42[4] - *pfVar42) * fVar85 + *pfVar42;
      fVar66 = (pfVar42[5] - pfVar42[1]) * fVar85 + pfVar42[1];
      fVar71 = (pfVar42[6] - pfVar42[2]) * fVar85 + pfVar42[2];
      fVar73 = (pfVar42[7] - pfVar42[3]) * fVar85 + pfVar42[3];
      (pvVar44->field_0).v[0] =
           (((pfVar42[8] - pfVar42[0xc]) * fVar85 + pfVar42[0xc]) - fVar69) * fVar83 + fVar69;
      (pvVar44->field_0).v[1] = (((fVar75 - fVar58) * fVar85 + fVar58) - fVar66) * fVar83 + fVar66;
      (pvVar44->field_0).v[2] = (((fVar93 - fVar67) * fVar85 + fVar67) - fVar71) * fVar83 + fVar71;
      (pvVar44->field_0).v[3] = (((fVar64 - fVar68) * fVar85 + fVar68) - fVar73) * fVar83 + fVar73;
    }
    if (pvVar2 != (vfloat_impl<4> *)0x0) {
      fVar75 = pfVar42[5];
      fVar93 = pfVar42[6];
      fVar64 = pfVar42[7];
      fVar58 = pfVar42[9];
      fVar67 = pfVar42[10];
      fVar68 = pfVar42[0xb];
      fVar69 = pfVar42[1];
      fVar66 = pfVar42[2];
      fVar71 = pfVar42[3];
      fVar73 = pfVar42[0xd];
      fVar74 = pfVar42[0xe];
      fVar70 = pfVar42[0xf];
      (pvVar2->field_0).v[0] =
           (((pfVar42[8] - pfVar42[0xc]) - (pfVar42[4] - *pfVar42)) * fVar83 +
           (pfVar42[4] - *pfVar42)) * dscale;
      (pvVar2->field_0).v[1] =
           (((fVar58 - fVar73) - (fVar75 - fVar69)) * fVar83 + (fVar75 - fVar69)) * dscale;
      (pvVar2->field_0).v[2] =
           (((fVar67 - fVar74) - (fVar93 - fVar66)) * fVar83 + (fVar93 - fVar66)) * dscale;
      (pvVar2->field_0).v[3] =
           (((fVar68 - fVar70) - (fVar64 - fVar71)) * fVar83 + (fVar64 - fVar71)) * dscale;
      fVar83 = pfVar42[9];
      fVar75 = pfVar42[10];
      fVar93 = pfVar42[0xb];
      fVar64 = pfVar42[0xd];
      fVar58 = pfVar42[0xe];
      fVar67 = pfVar42[0xf];
      fVar68 = pfVar42[1];
      fVar69 = pfVar42[2];
      fVar66 = pfVar42[3];
      fVar71 = pfVar42[5];
      fVar73 = pfVar42[6];
      fVar74 = pfVar42[7];
      (pvVar3->field_0).v[0] =
           (((pfVar42[8] - pfVar42[4]) - (pfVar42[0xc] - *pfVar42)) * fVar85 +
           (pfVar42[0xc] - *pfVar42)) * dscale;
      (pvVar3->field_0).v[1] =
           (((fVar83 - fVar71) - (fVar64 - fVar68)) * fVar85 + (fVar64 - fVar68)) * dscale;
      (pvVar3->field_0).v[2] =
           (((fVar75 - fVar73) - (fVar58 - fVar69)) * fVar85 + (fVar58 - fVar69)) * dscale;
      (pvVar3->field_0).v[3] =
           (((fVar93 - fVar74) - (fVar67 - fVar66)) * fVar85 + (fVar67 - fVar66)) * dscale;
    }
    bVar40 = true;
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar74 = dscale * dscale;
      fVar85 = fVar74 * 0.0;
      (pvVar4->field_0).v[0] = fVar85;
      (pvVar4->field_0).v[1] = fVar85;
      (pvVar4->field_0).v[2] = fVar85;
      (pvVar4->field_0).v[3] = fVar85;
      (pvVar5->field_0).v[0] = fVar85;
      (pvVar5->field_0).v[1] = fVar85;
      (pvVar5->field_0).v[2] = fVar85;
      (pvVar5->field_0).v[3] = fVar85;
      fVar85 = pfVar42[5];
      fVar83 = pfVar42[6];
      fVar75 = pfVar42[7];
      fVar93 = pfVar42[9];
      fVar64 = pfVar42[10];
      fVar58 = pfVar42[0xb];
      fVar67 = pfVar42[0xd];
      fVar68 = pfVar42[0xe];
      fVar69 = pfVar42[0xf];
      fVar66 = pfVar42[1];
      fVar71 = pfVar42[2];
      fVar73 = pfVar42[3];
      (pvVar6->field_0).v[0] = ((pfVar42[8] - pfVar42[0xc]) - (pfVar42[4] - *pfVar42)) * fVar74;
      (pvVar6->field_0).v[1] = ((fVar93 - fVar67) - (fVar85 - fVar66)) * fVar74;
      (pvVar6->field_0).v[2] = ((fVar64 - fVar68) - (fVar83 - fVar71)) * fVar74;
      (pvVar6->field_0).v[3] = ((fVar58 - fVar69) - (fVar75 - fVar73)) * fVar74;
    }
    break;
  case 2:
    BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval
              ((BSplinePatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *)
               (This.ptr & 0xfffffffffffffff0),*u,*v,this->P,this->dPdu,this->dPdv,this->ddPdudu,
               this->ddPdvdv,this->ddPdudv,dscale);
    goto LAB_005beb47;
  case 3:
    pfVar42 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar85 = *u;
    fVar83 = *v;
    pvVar44 = this->P;
    pvVar2 = this->dPdu;
    pvVar3 = this->dPdv;
    pvVar4 = this->ddPdudu;
    pvVar5 = this->ddPdvdv;
    pvVar6 = this->ddPdudv;
    if (pvVar44 != (vfloat_impl<4> *)0x0) {
      fVar75 = 1.0 - fVar85;
      fVar108 = fVar85 * fVar85 * fVar85;
      fVar57 = fVar85 * fVar85 * 3.0 * fVar75;
      fVar56 = fVar75 * fVar75 * fVar75;
      fVar90 = fVar85 * 3.0 * fVar75 * fVar75;
      fVar75 = 1.0 - fVar83;
      fVar52 = fVar83 * fVar83 * 3.0 * fVar75;
      fVar55 = fVar75 * fVar75 * fVar75;
      fVar59 = fVar83 * 3.0 * fVar75 * fVar75;
      fVar54 = fVar83 * fVar83 * fVar83;
      fVar75 = pfVar42[0xd];
      fVar93 = pfVar42[0xe];
      fVar64 = pfVar42[0xf];
      fVar58 = pfVar42[9];
      fVar67 = pfVar42[10];
      fVar68 = pfVar42[0xb];
      fVar69 = pfVar42[5];
      fVar66 = pfVar42[6];
      fVar71 = pfVar42[7];
      fVar73 = pfVar42[1];
      fVar74 = pfVar42[2];
      fVar70 = pfVar42[3];
      fVar77 = pfVar42[0x1d];
      fVar81 = pfVar42[0x1e];
      fVar82 = pfVar42[0x1f];
      fVar76 = pfVar42[0x19];
      fVar84 = pfVar42[0x1a];
      fVar99 = pfVar42[0x1b];
      fVar102 = pfVar42[0x15];
      fVar11 = pfVar42[0x16];
      fVar12 = pfVar42[0x17];
      fVar13 = pfVar42[0x11];
      fVar14 = pfVar42[0x12];
      fVar15 = pfVar42[0x13];
      fVar16 = pfVar42[0x2d];
      fVar17 = pfVar42[0x2e];
      fVar18 = pfVar42[0x2f];
      fVar19 = pfVar42[0x29];
      fVar20 = pfVar42[0x2a];
      fVar21 = pfVar42[0x2b];
      fVar22 = pfVar42[0x25];
      fVar23 = pfVar42[0x26];
      fVar24 = pfVar42[0x27];
      fVar25 = pfVar42[0x21];
      fVar26 = pfVar42[0x22];
      fVar27 = pfVar42[0x23];
      fVar28 = pfVar42[0x3d];
      fVar29 = pfVar42[0x3e];
      fVar30 = pfVar42[0x3f];
      fVar31 = pfVar42[0x39];
      fVar32 = pfVar42[0x3a];
      fVar33 = pfVar42[0x3b];
      fVar34 = pfVar42[0x35];
      fVar35 = pfVar42[0x36];
      fVar36 = pfVar42[0x37];
      fVar37 = pfVar42[0x31];
      fVar65 = pfVar42[0x32];
      fVar53 = pfVar42[0x33];
      (pvVar44->field_0).v[0] =
           fVar54 * (fVar56 * pfVar42[0x30] +
                    fVar90 * pfVar42[0x34] + fVar57 * pfVar42[0x38] + fVar108 * pfVar42[0x3c]) +
           fVar52 * (pfVar42[0x20] * fVar56 +
                    pfVar42[0x24] * fVar90 + pfVar42[0x28] * fVar57 + pfVar42[0x2c] * fVar108) +
           fVar59 * (pfVar42[0x10] * fVar56 +
                    pfVar42[0x14] * fVar90 + pfVar42[0x18] * fVar57 + pfVar42[0x1c] * fVar108) +
           fVar55 * (*pfVar42 * fVar56 +
                    pfVar42[4] * fVar90 + pfVar42[8] * fVar57 + pfVar42[0xc] * fVar108);
      (pvVar44->field_0).v[1] =
           fVar54 * (fVar56 * fVar37 + fVar90 * fVar34 + fVar57 * fVar31 + fVar108 * fVar28) +
           fVar52 * (fVar25 * fVar56 + fVar22 * fVar90 + fVar19 * fVar57 + fVar16 * fVar108) +
           fVar59 * (fVar13 * fVar56 + fVar102 * fVar90 + fVar76 * fVar57 + fVar77 * fVar108) +
           fVar55 * (fVar73 * fVar56 + fVar69 * fVar90 + fVar58 * fVar57 + fVar75 * fVar108);
      (pvVar44->field_0).v[2] =
           fVar54 * (fVar56 * fVar65 + fVar90 * fVar35 + fVar57 * fVar32 + fVar108 * fVar29) +
           fVar52 * (fVar26 * fVar56 + fVar23 * fVar90 + fVar20 * fVar57 + fVar17 * fVar108) +
           fVar59 * (fVar14 * fVar56 + fVar11 * fVar90 + fVar84 * fVar57 + fVar81 * fVar108) +
           fVar55 * (fVar74 * fVar56 + fVar66 * fVar90 + fVar67 * fVar57 + fVar93 * fVar108);
      (pvVar44->field_0).v[3] =
           fVar54 * (fVar56 * fVar53 + fVar90 * fVar36 + fVar57 * fVar33 + fVar108 * fVar30) +
           fVar52 * (fVar27 * fVar56 + fVar24 * fVar90 + fVar21 * fVar57 + fVar18 * fVar108) +
           fVar59 * (fVar15 * fVar56 + fVar12 * fVar90 + fVar99 * fVar57 + fVar82 * fVar108) +
           fVar55 * (fVar70 * fVar56 + fVar71 * fVar90 + fVar68 * fVar57 + fVar64 * fVar108);
    }
    if (pvVar2 != (vfloat_impl<4> *)0x0) {
      fVar52 = 1.0 - fVar85;
      fVar95 = fVar85 * fVar85;
      fVar55 = fVar95 * 3.0;
      fVar59 = fVar55 * fVar52;
      fVar75 = fVar52 * fVar52;
      fVar93 = fVar85 * fVar52 + fVar85 * fVar52;
      fVar52 = fVar52 * fVar75;
      fVar103 = fVar85 * 3.0 * fVar75;
      fVar106 = fVar75 * -3.0;
      fVar54 = (fVar75 - fVar93) * 3.0;
      fVar98 = (fVar93 - fVar95) * 3.0;
      fVar94 = 1.0 - fVar83;
      fVar90 = fVar94 * fVar94;
      fVar75 = pfVar42[0xd];
      fVar93 = pfVar42[0xe];
      fVar64 = pfVar42[0xf];
      fVar58 = pfVar42[9];
      fVar67 = pfVar42[10];
      fVar68 = pfVar42[0xb];
      fVar69 = pfVar42[5];
      fVar66 = pfVar42[6];
      fVar71 = pfVar42[7];
      fVar73 = pfVar42[1];
      fVar74 = pfVar42[2];
      fVar70 = pfVar42[3];
      fVar77 = pfVar42[0x1d];
      fVar81 = pfVar42[0x1e];
      fVar82 = pfVar42[0x1f];
      fVar76 = pfVar42[0x19];
      fVar84 = pfVar42[0x1a];
      fVar99 = pfVar42[0x1b];
      fVar102 = pfVar42[0x15];
      fVar11 = pfVar42[0x16];
      fVar12 = pfVar42[0x17];
      fVar13 = pfVar42[0x11];
      fVar14 = pfVar42[0x12];
      fVar15 = pfVar42[0x13];
      fVar16 = pfVar42[0x2d];
      fVar17 = pfVar42[0x2e];
      fVar18 = pfVar42[0x2f];
      fVar19 = pfVar42[0x29];
      fVar20 = pfVar42[0x2a];
      fVar21 = pfVar42[0x2b];
      fVar22 = pfVar42[0x25];
      fVar23 = pfVar42[0x26];
      fVar24 = pfVar42[0x27];
      fVar25 = pfVar42[0x21];
      fVar26 = pfVar42[0x22];
      fVar27 = pfVar42[0x23];
      fVar28 = pfVar42[0x3d];
      fVar29 = pfVar42[0x3e];
      fVar30 = pfVar42[0x3f];
      fVar31 = pfVar42[0x39];
      fVar32 = pfVar42[0x3a];
      fVar33 = pfVar42[0x3b];
      fVar110 = fVar94 * fVar90;
      fVar105 = fVar83 * 3.0 * fVar90;
      fVar34 = pfVar42[0x35];
      fVar35 = pfVar42[0x36];
      fVar36 = pfVar42[0x37];
      fVar56 = fVar83 * fVar83;
      fVar37 = pfVar42[0x31];
      fVar65 = pfVar42[0x32];
      fVar53 = pfVar42[0x33];
      fVar100 = fVar83 * fVar56;
      fVar57 = fVar94 * fVar83 + fVar94 * fVar83;
      fVar108 = fVar56 * 3.0;
      fVar94 = fVar94 * fVar108;
      (pvVar2->field_0).v[0] =
           (fVar100 * (fVar106 * pfVar42[0x30] +
                      fVar54 * pfVar42[0x34] + fVar98 * pfVar42[0x38] + fVar55 * pfVar42[0x3c]) +
            fVar94 * (pfVar42[0x20] * fVar106 +
                     pfVar42[0x24] * fVar54 + pfVar42[0x28] * fVar98 + pfVar42[0x2c] * fVar55) +
            fVar105 * (pfVar42[0x10] * fVar106 +
                      pfVar42[0x14] * fVar54 + pfVar42[0x18] * fVar98 + pfVar42[0x1c] * fVar55) +
           fVar110 * (*pfVar42 * fVar106 +
                     pfVar42[4] * fVar54 + pfVar42[8] * fVar98 + pfVar42[0xc] * fVar55)) * dscale;
      (pvVar2->field_0).v[1] =
           (fVar100 * (fVar106 * fVar37 + fVar54 * fVar34 + fVar98 * fVar31 + fVar55 * fVar28) +
            fVar94 * (fVar25 * fVar106 + fVar22 * fVar54 + fVar19 * fVar98 + fVar16 * fVar55) +
            fVar105 * (fVar13 * fVar106 + fVar102 * fVar54 + fVar76 * fVar98 + fVar77 * fVar55) +
           fVar110 * (fVar73 * fVar106 + fVar69 * fVar54 + fVar58 * fVar98 + fVar75 * fVar55)) *
           dscale;
      (pvVar2->field_0).v[2] =
           (fVar100 * (fVar106 * fVar65 + fVar54 * fVar35 + fVar98 * fVar32 + fVar55 * fVar29) +
            fVar94 * (fVar26 * fVar106 + fVar23 * fVar54 + fVar20 * fVar98 + fVar17 * fVar55) +
            fVar105 * (fVar14 * fVar106 + fVar11 * fVar54 + fVar84 * fVar98 + fVar81 * fVar55) +
           fVar110 * (fVar74 * fVar106 + fVar66 * fVar54 + fVar67 * fVar98 + fVar93 * fVar55)) *
           dscale;
      (pvVar2->field_0).v[3] =
           (fVar100 * (fVar106 * fVar53 + fVar54 * fVar36 + fVar98 * fVar33 + fVar55 * fVar30) +
            fVar94 * (fVar27 * fVar106 + fVar24 * fVar54 + fVar21 * fVar98 + fVar18 * fVar55) +
            fVar105 * (fVar15 * fVar106 + fVar12 * fVar54 + fVar99 * fVar98 + fVar82 * fVar55) +
           fVar110 * (fVar70 * fVar106 + fVar71 * fVar54 + fVar68 * fVar98 + fVar64 * fVar55)) *
           dscale;
      fVar95 = fVar95 * fVar85;
      fVar55 = fVar90 * -3.0;
      fVar54 = (fVar90 - fVar57) * 3.0;
      fVar56 = (fVar57 - fVar56) * 3.0;
      fVar75 = pfVar42[0xd];
      fVar93 = pfVar42[0xe];
      fVar64 = pfVar42[0xf];
      fVar58 = pfVar42[9];
      fVar67 = pfVar42[10];
      fVar68 = pfVar42[0xb];
      fVar69 = pfVar42[5];
      fVar66 = pfVar42[6];
      fVar71 = pfVar42[7];
      fVar73 = pfVar42[1];
      fVar74 = pfVar42[2];
      fVar70 = pfVar42[3];
      fVar77 = pfVar42[0x1d];
      fVar81 = pfVar42[0x1e];
      fVar82 = pfVar42[0x1f];
      fVar76 = pfVar42[0x19];
      fVar84 = pfVar42[0x1a];
      fVar99 = pfVar42[0x1b];
      fVar102 = pfVar42[0x15];
      fVar11 = pfVar42[0x16];
      fVar12 = pfVar42[0x17];
      fVar13 = pfVar42[0x11];
      fVar14 = pfVar42[0x12];
      fVar15 = pfVar42[0x13];
      fVar16 = pfVar42[0x2d];
      fVar17 = pfVar42[0x2e];
      fVar18 = pfVar42[0x2f];
      fVar19 = pfVar42[0x29];
      fVar20 = pfVar42[0x2a];
      fVar21 = pfVar42[0x2b];
      fVar22 = pfVar42[0x25];
      fVar23 = pfVar42[0x26];
      fVar24 = pfVar42[0x27];
      fVar25 = pfVar42[0x21];
      fVar26 = pfVar42[0x22];
      fVar27 = pfVar42[0x23];
      fVar28 = pfVar42[0x3d];
      fVar29 = pfVar42[0x3e];
      fVar30 = pfVar42[0x3f];
      fVar31 = pfVar42[0x39];
      fVar32 = pfVar42[0x3a];
      fVar33 = pfVar42[0x3b];
      fVar34 = pfVar42[0x35];
      fVar35 = pfVar42[0x36];
      fVar36 = pfVar42[0x37];
      fVar37 = pfVar42[0x31];
      fVar65 = pfVar42[0x32];
      fVar53 = pfVar42[0x33];
      (pvVar3->field_0).v[0] =
           (fVar108 * (fVar52 * pfVar42[0x30] +
                      fVar103 * pfVar42[0x34] + fVar59 * pfVar42[0x38] + fVar95 * pfVar42[0x3c]) +
            fVar56 * (pfVar42[0x20] * fVar52 +
                     pfVar42[0x24] * fVar103 + pfVar42[0x28] * fVar59 + pfVar42[0x2c] * fVar95) +
            fVar54 * (pfVar42[0x10] * fVar52 +
                     pfVar42[0x14] * fVar103 + pfVar42[0x18] * fVar59 + pfVar42[0x1c] * fVar95) +
           fVar55 * (*pfVar42 * fVar52 +
                    pfVar42[4] * fVar103 + pfVar42[8] * fVar59 + pfVar42[0xc] * fVar95)) * dscale;
      (pvVar3->field_0).v[1] =
           (fVar108 * (fVar52 * fVar37 + fVar103 * fVar34 + fVar59 * fVar31 + fVar95 * fVar28) +
            fVar56 * (fVar25 * fVar52 + fVar22 * fVar103 + fVar19 * fVar59 + fVar16 * fVar95) +
            fVar54 * (fVar13 * fVar52 + fVar102 * fVar103 + fVar76 * fVar59 + fVar77 * fVar95) +
           fVar55 * (fVar73 * fVar52 + fVar69 * fVar103 + fVar58 * fVar59 + fVar75 * fVar95)) *
           dscale;
      (pvVar3->field_0).v[2] =
           (fVar108 * (fVar52 * fVar65 + fVar103 * fVar35 + fVar59 * fVar32 + fVar95 * fVar29) +
            fVar56 * (fVar26 * fVar52 + fVar23 * fVar103 + fVar20 * fVar59 + fVar17 * fVar95) +
            fVar54 * (fVar14 * fVar52 + fVar11 * fVar103 + fVar84 * fVar59 + fVar81 * fVar95) +
           fVar55 * (fVar74 * fVar52 + fVar66 * fVar103 + fVar67 * fVar59 + fVar93 * fVar95)) *
           dscale;
      (pvVar3->field_0).v[3] =
           (fVar108 * (fVar52 * fVar53 + fVar103 * fVar36 + fVar59 * fVar33 + fVar95 * fVar30) +
            fVar56 * (fVar27 * fVar52 + fVar24 * fVar103 + fVar21 * fVar59 + fVar18 * fVar95) +
            fVar54 * (fVar15 * fVar52 + fVar12 * fVar103 + fVar99 * fVar59 + fVar82 * fVar95) +
           fVar55 * (fVar70 * fVar52 + fVar71 * fVar103 + fVar68 * fVar59 + fVar64 * fVar95)) *
           dscale;
    }
    bVar40 = true;
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      fVar108 = 1.0 - fVar85;
      fVar90 = fVar108 * 6.0;
      fVar52 = (fVar85 - (fVar108 + fVar108)) * 6.0;
      fVar59 = (fVar108 - (fVar85 + fVar85)) * 6.0;
      fVar103 = fVar85 * 6.0;
      fVar94 = 1.0 - fVar83;
      fVar54 = fVar94 * fVar94;
      fVar98 = fVar94 * fVar54;
      fVar75 = pfVar42[0xd];
      fVar93 = pfVar42[0xe];
      fVar64 = pfVar42[0xf];
      fVar58 = pfVar42[9];
      fVar67 = pfVar42[10];
      fVar68 = pfVar42[0xb];
      fVar69 = pfVar42[5];
      fVar66 = pfVar42[6];
      fVar71 = pfVar42[7];
      fVar73 = pfVar42[1];
      fVar74 = pfVar42[2];
      fVar70 = pfVar42[3];
      fVar77 = pfVar42[0x1d];
      fVar81 = pfVar42[0x1e];
      fVar82 = pfVar42[0x1f];
      fVar76 = pfVar42[0x19];
      fVar84 = pfVar42[0x1a];
      fVar99 = pfVar42[0x1b];
      fVar102 = pfVar42[0x15];
      fVar11 = pfVar42[0x16];
      fVar12 = pfVar42[0x17];
      fVar13 = pfVar42[0x11];
      fVar14 = pfVar42[0x12];
      fVar15 = pfVar42[0x13];
      fVar16 = pfVar42[0x2d];
      fVar17 = pfVar42[0x2e];
      fVar18 = pfVar42[0x2f];
      fVar19 = pfVar42[0x29];
      fVar20 = pfVar42[0x2a];
      fVar21 = pfVar42[0x2b];
      fVar22 = pfVar42[0x25];
      fVar23 = pfVar42[0x26];
      fVar24 = pfVar42[0x27];
      fVar25 = pfVar42[0x21];
      fVar26 = pfVar42[0x22];
      fVar27 = pfVar42[0x23];
      fVar28 = pfVar42[0x3d];
      fVar29 = pfVar42[0x3e];
      fVar30 = pfVar42[0x3f];
      fVar31 = pfVar42[0x39];
      fVar32 = pfVar42[0x3a];
      fVar33 = pfVar42[0x3b];
      fVar106 = fVar83 * 3.0 * fVar54;
      fVar34 = pfVar42[0x35];
      fVar35 = pfVar42[0x36];
      fVar36 = pfVar42[0x37];
      fVar105 = fVar83 * fVar83;
      fVar37 = pfVar42[0x31];
      fVar65 = pfVar42[0x32];
      fVar53 = pfVar42[0x33];
      fVar100 = fVar83 * fVar105;
      fVar57 = fVar94 * fVar83 + fVar94 * fVar83;
      fVar95 = fVar105 * 3.0;
      fVar56 = fVar94 * fVar95;
      fVar55 = dscale * dscale;
      (pvVar4->field_0).v[0] =
           (fVar100 * (fVar90 * pfVar42[0x30] +
                      fVar52 * pfVar42[0x34] + fVar59 * pfVar42[0x38] + fVar103 * pfVar42[0x3c]) +
            fVar56 * (pfVar42[0x20] * fVar90 +
                     pfVar42[0x24] * fVar52 + pfVar42[0x28] * fVar59 + pfVar42[0x2c] * fVar103) +
            fVar106 * (pfVar42[0x10] * fVar90 +
                      pfVar42[0x14] * fVar52 + pfVar42[0x18] * fVar59 + pfVar42[0x1c] * fVar103) +
           fVar98 * (*pfVar42 * fVar90 +
                    pfVar42[4] * fVar52 + pfVar42[8] * fVar59 + pfVar42[0xc] * fVar103)) * fVar55;
      (pvVar4->field_0).v[1] =
           (fVar100 * (fVar90 * fVar37 + fVar52 * fVar34 + fVar59 * fVar31 + fVar103 * fVar28) +
            fVar56 * (fVar25 * fVar90 + fVar22 * fVar52 + fVar19 * fVar59 + fVar16 * fVar103) +
            fVar106 * (fVar13 * fVar90 + fVar102 * fVar52 + fVar76 * fVar59 + fVar77 * fVar103) +
           fVar98 * (fVar73 * fVar90 + fVar69 * fVar52 + fVar58 * fVar59 + fVar75 * fVar103)) *
           fVar55;
      (pvVar4->field_0).v[2] =
           (fVar100 * (fVar90 * fVar65 + fVar52 * fVar35 + fVar59 * fVar32 + fVar103 * fVar29) +
            fVar56 * (fVar26 * fVar90 + fVar23 * fVar52 + fVar20 * fVar59 + fVar17 * fVar103) +
            fVar106 * (fVar14 * fVar90 + fVar11 * fVar52 + fVar84 * fVar59 + fVar81 * fVar103) +
           fVar98 * (fVar74 * fVar90 + fVar66 * fVar52 + fVar67 * fVar59 + fVar93 * fVar103)) *
           fVar55;
      (pvVar4->field_0).v[3] =
           (fVar100 * (fVar90 * fVar53 + fVar52 * fVar36 + fVar59 * fVar33 + fVar103 * fVar30) +
            fVar56 * (fVar27 * fVar90 + fVar24 * fVar52 + fVar21 * fVar59 + fVar18 * fVar103) +
            fVar106 * (fVar15 * fVar90 + fVar12 * fVar52 + fVar99 * fVar59 + fVar82 * fVar103) +
           fVar98 * (fVar70 * fVar90 + fVar71 * fVar52 + fVar68 * fVar59 + fVar64 * fVar103)) *
           fVar55;
      fVar98 = fVar108 * fVar108;
      fVar56 = fVar85 * fVar85;
      fVar53 = fVar94 * 6.0;
      fVar90 = (fVar83 - (fVar94 + fVar94)) * 6.0;
      fVar94 = (fVar94 - (fVar83 + fVar83)) * 6.0;
      fVar83 = fVar83 * 6.0;
      fVar100 = fVar85 * fVar56;
      fVar103 = fVar108 * fVar85 + fVar108 * fVar85;
      fVar59 = fVar56 * 3.0;
      fVar106 = fVar108 * fVar59;
      fVar75 = pfVar42[0xd];
      fVar93 = pfVar42[0xe];
      fVar64 = pfVar42[0xf];
      fVar58 = pfVar42[9];
      fVar67 = pfVar42[10];
      fVar68 = pfVar42[0xb];
      fVar52 = fVar85 * 3.0 * fVar98;
      fVar85 = pfVar42[5];
      fVar69 = pfVar42[6];
      fVar66 = pfVar42[7];
      fVar108 = fVar108 * fVar98;
      fVar71 = pfVar42[1];
      fVar73 = pfVar42[2];
      fVar74 = pfVar42[3];
      fVar70 = pfVar42[0x1d];
      fVar77 = pfVar42[0x1e];
      fVar81 = pfVar42[0x1f];
      fVar82 = pfVar42[0x19];
      fVar76 = pfVar42[0x1a];
      fVar84 = pfVar42[0x1b];
      fVar99 = pfVar42[0x15];
      fVar102 = pfVar42[0x16];
      fVar11 = pfVar42[0x17];
      fVar12 = pfVar42[0x11];
      fVar13 = pfVar42[0x12];
      fVar14 = pfVar42[0x13];
      fVar15 = pfVar42[0x2d];
      fVar16 = pfVar42[0x2e];
      fVar17 = pfVar42[0x2f];
      fVar18 = pfVar42[0x29];
      fVar19 = pfVar42[0x2a];
      fVar20 = pfVar42[0x2b];
      fVar21 = pfVar42[0x25];
      fVar22 = pfVar42[0x26];
      fVar23 = pfVar42[0x27];
      fVar24 = pfVar42[0x21];
      fVar25 = pfVar42[0x22];
      fVar26 = pfVar42[0x23];
      fVar27 = pfVar42[0x3d];
      fVar28 = pfVar42[0x3e];
      fVar29 = pfVar42[0x3f];
      fVar30 = pfVar42[0x39];
      fVar31 = pfVar42[0x3a];
      fVar32 = pfVar42[0x3b];
      fVar33 = pfVar42[0x35];
      fVar34 = pfVar42[0x36];
      fVar35 = pfVar42[0x37];
      fVar36 = pfVar42[0x31];
      fVar37 = pfVar42[0x32];
      fVar65 = pfVar42[0x33];
      (pvVar5->field_0).v[0] =
           (fVar83 * (fVar108 * pfVar42[0x30] +
                     fVar52 * pfVar42[0x34] + fVar106 * pfVar42[0x38] + fVar100 * pfVar42[0x3c]) +
            fVar94 * (pfVar42[0x20] * fVar108 +
                     pfVar42[0x24] * fVar52 + pfVar42[0x28] * fVar106 + pfVar42[0x2c] * fVar100) +
            fVar90 * (pfVar42[0x10] * fVar108 +
                     pfVar42[0x14] * fVar52 + pfVar42[0x18] * fVar106 + pfVar42[0x1c] * fVar100) +
           fVar53 * (*pfVar42 * fVar108 +
                    pfVar42[4] * fVar52 + pfVar42[8] * fVar106 + pfVar42[0xc] * fVar100)) * fVar55;
      (pvVar5->field_0).v[1] =
           (fVar83 * (fVar108 * fVar36 + fVar52 * fVar33 + fVar106 * fVar30 + fVar100 * fVar27) +
            fVar94 * (fVar24 * fVar108 + fVar21 * fVar52 + fVar18 * fVar106 + fVar15 * fVar100) +
            fVar90 * (fVar12 * fVar108 + fVar99 * fVar52 + fVar82 * fVar106 + fVar70 * fVar100) +
           fVar53 * (fVar71 * fVar108 + fVar85 * fVar52 + fVar58 * fVar106 + fVar75 * fVar100)) *
           fVar55;
      (pvVar5->field_0).v[2] =
           (fVar83 * (fVar108 * fVar37 + fVar52 * fVar34 + fVar106 * fVar31 + fVar100 * fVar28) +
            fVar94 * (fVar25 * fVar108 + fVar22 * fVar52 + fVar19 * fVar106 + fVar16 * fVar100) +
            fVar90 * (fVar13 * fVar108 + fVar102 * fVar52 + fVar76 * fVar106 + fVar77 * fVar100) +
           fVar53 * (fVar73 * fVar108 + fVar69 * fVar52 + fVar67 * fVar106 + fVar93 * fVar100)) *
           fVar55;
      (pvVar5->field_0).v[3] =
           (fVar83 * (fVar108 * fVar65 + fVar52 * fVar35 + fVar106 * fVar32 + fVar100 * fVar29) +
            fVar94 * (fVar26 * fVar108 + fVar23 * fVar52 + fVar20 * fVar106 + fVar17 * fVar100) +
            fVar90 * (fVar14 * fVar108 + fVar11 * fVar52 + fVar84 * fVar106 + fVar81 * fVar100) +
           fVar53 * (fVar74 * fVar108 + fVar66 * fVar52 + fVar68 * fVar106 + fVar64 * fVar100)) *
           fVar55;
      fVar108 = fVar98 * -3.0;
      fVar53 = (fVar98 - fVar103) * 3.0;
      fVar56 = (fVar103 - fVar56) * 3.0;
      fVar65 = fVar54 * -3.0;
      fVar54 = (fVar54 - fVar57) * 3.0;
      fVar52 = (fVar57 - fVar105) * 3.0;
      fVar85 = pfVar42[0xd];
      fVar83 = pfVar42[0xe];
      fVar75 = pfVar42[0xf];
      fVar93 = pfVar42[9];
      fVar64 = pfVar42[10];
      fVar58 = pfVar42[0xb];
      fVar67 = pfVar42[5];
      fVar68 = pfVar42[6];
      fVar69 = pfVar42[7];
      fVar66 = pfVar42[1];
      fVar71 = pfVar42[2];
      fVar73 = pfVar42[3];
      fVar74 = pfVar42[0x1d];
      fVar70 = pfVar42[0x1e];
      fVar77 = pfVar42[0x1f];
      fVar81 = pfVar42[0x19];
      fVar82 = pfVar42[0x1a];
      fVar76 = pfVar42[0x1b];
      fVar84 = pfVar42[0x15];
      fVar99 = pfVar42[0x16];
      fVar102 = pfVar42[0x17];
      fVar11 = pfVar42[0x11];
      fVar12 = pfVar42[0x12];
      fVar13 = pfVar42[0x13];
      fVar14 = pfVar42[0x2d];
      fVar15 = pfVar42[0x2e];
      fVar16 = pfVar42[0x2f];
      fVar17 = pfVar42[0x29];
      fVar18 = pfVar42[0x2a];
      fVar19 = pfVar42[0x2b];
      fVar20 = pfVar42[0x25];
      fVar21 = pfVar42[0x26];
      fVar22 = pfVar42[0x27];
      fVar23 = pfVar42[0x21];
      fVar24 = pfVar42[0x22];
      fVar25 = pfVar42[0x23];
      fVar26 = pfVar42[0x3d];
      fVar27 = pfVar42[0x3e];
      fVar28 = pfVar42[0x3f];
      fVar29 = pfVar42[0x39];
      fVar30 = pfVar42[0x3a];
      fVar31 = pfVar42[0x3b];
      fVar32 = pfVar42[0x35];
      fVar33 = pfVar42[0x36];
      fVar34 = pfVar42[0x37];
      fVar35 = pfVar42[0x31];
      fVar36 = pfVar42[0x32];
      fVar37 = pfVar42[0x33];
      (pvVar6->field_0).v[0] =
           (fVar95 * (fVar108 * pfVar42[0x30] +
                     fVar53 * pfVar42[0x34] + fVar56 * pfVar42[0x38] + fVar59 * pfVar42[0x3c]) +
            fVar52 * (pfVar42[0x20] * fVar108 +
                     pfVar42[0x24] * fVar53 + pfVar42[0x28] * fVar56 + pfVar42[0x2c] * fVar59) +
            fVar54 * (pfVar42[0x10] * fVar108 +
                     pfVar42[0x14] * fVar53 + pfVar42[0x18] * fVar56 + pfVar42[0x1c] * fVar59) +
           fVar65 * (*pfVar42 * fVar108 +
                    pfVar42[4] * fVar53 + pfVar42[8] * fVar56 + pfVar42[0xc] * fVar59)) * fVar55;
      (pvVar6->field_0).v[1] =
           (fVar95 * (fVar108 * fVar35 + fVar53 * fVar32 + fVar56 * fVar29 + fVar59 * fVar26) +
            fVar52 * (fVar23 * fVar108 + fVar20 * fVar53 + fVar17 * fVar56 + fVar14 * fVar59) +
            fVar54 * (fVar11 * fVar108 + fVar84 * fVar53 + fVar81 * fVar56 + fVar74 * fVar59) +
           fVar65 * (fVar66 * fVar108 + fVar67 * fVar53 + fVar93 * fVar56 + fVar85 * fVar59)) *
           fVar55;
      (pvVar6->field_0).v[2] =
           (fVar95 * (fVar108 * fVar36 + fVar53 * fVar33 + fVar56 * fVar30 + fVar59 * fVar27) +
            fVar52 * (fVar24 * fVar108 + fVar21 * fVar53 + fVar18 * fVar56 + fVar15 * fVar59) +
            fVar54 * (fVar12 * fVar108 + fVar99 * fVar53 + fVar82 * fVar56 + fVar70 * fVar59) +
           fVar65 * (fVar71 * fVar108 + fVar68 * fVar53 + fVar64 * fVar56 + fVar83 * fVar59)) *
           fVar55;
      (pvVar6->field_0).v[3] =
           (fVar95 * (fVar108 * fVar37 + fVar53 * fVar34 + fVar56 * fVar31 + fVar59 * fVar28) +
            fVar52 * (fVar25 * fVar108 + fVar22 * fVar53 + fVar19 * fVar56 + fVar16 * fVar59) +
            fVar54 * (fVar13 * fVar108 + fVar102 * fVar53 + fVar76 * fVar56 + fVar77 * fVar59) +
           fVar65 * (fVar73 * fVar108 + fVar69 * fVar53 + fVar58 * fVar56 + fVar75 * fVar59)) *
           fVar55;
    }
    break;
  case 4:
    pfVar42 = (float *)(This.ptr & 0xfffffffffffffff0);
    fVar85 = *u;
    fVar83 = *v;
    pvVar44 = this->P;
    pvVar2 = this->dPdu;
    pvVar3 = this->dPdv;
    pvVar4 = this->ddPdudu;
    pvVar5 = this->ddPdvdv;
    pvVar6 = this->ddPdudv;
    if (pvVar44 != (vfloat_impl<4> *)0x0) {
      if (((((fVar83 == 1.0) && (!NAN(fVar83))) || ((fVar85 == 0.0 && (!NAN(fVar85))))) ||
          ((fVar85 == 1.0 && (!NAN(fVar85))))) || ((fVar83 == 0.0 && (!NAN(fVar83))))) {
        fVar67 = pfVar42[0x14];
        fVar68 = pfVar42[0x15];
        fVar69 = pfVar42[0x16];
        fVar66 = pfVar42[0x17];
        fVar71 = pfVar42[0x18];
        fVar73 = pfVar42[0x19];
        fVar74 = pfVar42[0x1a];
        fVar70 = pfVar42[0x1b];
        fVar75 = pfVar42[0x24];
        fVar93 = pfVar42[0x25];
        fVar64 = pfVar42[0x26];
        fVar58 = pfVar42[0x27];
        fVar77 = pfVar42[0x28];
        fVar81 = pfVar42[0x29];
        fVar82 = pfVar42[0x2a];
        fVar76 = pfVar42[0x2b];
      }
      else {
        fVar75 = fVar85 + fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
        fVar66 = (2.0 - fVar75 * auVar86._0_4_) * auVar86._0_4_;
        fVar67 = fVar66 * (pfVar42[0x40] * fVar83 + pfVar42[0x14] * fVar85);
        fVar68 = fVar66 * (pfVar42[0x41] * fVar83 + pfVar42[0x15] * fVar85);
        fVar69 = fVar66 * (pfVar42[0x42] * fVar83 + pfVar42[0x16] * fVar85);
        fVar66 = fVar66 * (pfVar42[0x43] * fVar83 + pfVar42[0x17] * fVar85);
        fVar84 = 1.0 - fVar83;
        fVar75 = 1.0 - fVar85;
        auVar86._4_4_ = fVar75;
        auVar86._0_4_ = fVar75;
        auVar86._8_4_ = fVar75;
        auVar86._12_4_ = fVar75;
        auVar91._4_12_ = auVar86._4_12_;
        auVar91._0_4_ = fVar75 + fVar83;
        auVar96._4_4_ = fVar75;
        auVar96._0_4_ = auVar91._0_4_;
        auVar96._8_4_ = fVar75;
        auVar96._12_4_ = fVar75;
        auVar86 = rcpss(auVar96,auVar91);
        fVar70 = (2.0 - auVar91._0_4_ * auVar86._0_4_) * auVar86._0_4_;
        fVar71 = fVar70 * (fVar83 * pfVar42[0x18] + pfVar42[0x44] * fVar75);
        fVar73 = fVar70 * (fVar83 * pfVar42[0x19] + pfVar42[0x45] * fVar75);
        fVar74 = fVar70 * (fVar83 * pfVar42[0x1a] + pfVar42[0x46] * fVar75);
        fVar70 = fVar70 * (fVar83 * pfVar42[0x1b] + pfVar42[0x47] * fVar75);
        fVar93 = (2.0 - fVar85) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93));
        fVar76 = (2.0 - fVar93 * auVar86._0_4_) * auVar86._0_4_;
        fVar77 = fVar76 * (pfVar42[0x4c] * fVar84 + fVar75 * pfVar42[0x28]);
        fVar81 = fVar76 * (pfVar42[0x4d] * fVar84 + fVar75 * pfVar42[0x29]);
        fVar82 = fVar76 * (pfVar42[0x4e] * fVar84 + fVar75 * pfVar42[0x2a]);
        fVar76 = fVar76 * (pfVar42[0x4f] * fVar84 + fVar75 * pfVar42[0x2b]);
        fVar75 = (fVar85 + 1.0) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar75),ZEXT416((uint)fVar75));
        fVar58 = (2.0 - fVar75 * auVar86._0_4_) * auVar86._0_4_;
        fVar75 = fVar58 * (fVar84 * pfVar42[0x24] + fVar85 * pfVar42[0x48]);
        fVar93 = fVar58 * (fVar84 * pfVar42[0x25] + fVar85 * pfVar42[0x49]);
        fVar64 = fVar58 * (fVar84 * pfVar42[0x26] + fVar85 * pfVar42[0x4a]);
        fVar58 = fVar58 * (fVar84 * pfVar42[0x27] + fVar85 * pfVar42[0x4b]);
      }
      fVar84 = 1.0 - fVar85;
      fVar108 = 1.0 - fVar83;
      fVar103 = fVar85 * fVar85 * fVar85;
      fVar54 = fVar85 * fVar85 * 3.0 * fVar84;
      fVar90 = fVar84 * fVar84 * fVar84;
      fVar98 = fVar85 * 3.0 * fVar84 * fVar84;
      fVar105 = fVar83 * 3.0 * fVar108 * fVar108;
      fVar57 = fVar83 * fVar83 * 3.0 * fVar108;
      fVar94 = fVar83 * fVar83 * fVar83;
      fVar108 = fVar108 * fVar108 * fVar108;
      fVar84 = pfVar42[0xd];
      fVar99 = pfVar42[0xe];
      fVar102 = pfVar42[0xf];
      fVar11 = pfVar42[9];
      fVar12 = pfVar42[10];
      fVar13 = pfVar42[0xb];
      fVar14 = pfVar42[5];
      fVar15 = pfVar42[6];
      fVar16 = pfVar42[7];
      fVar17 = pfVar42[1];
      fVar18 = pfVar42[2];
      fVar19 = pfVar42[3];
      fVar20 = pfVar42[0x1d];
      fVar21 = pfVar42[0x1e];
      fVar22 = pfVar42[0x1f];
      fVar23 = pfVar42[0x11];
      fVar24 = pfVar42[0x12];
      fVar25 = pfVar42[0x13];
      fVar26 = pfVar42[0x2d];
      fVar27 = pfVar42[0x2e];
      fVar28 = pfVar42[0x2f];
      fVar29 = pfVar42[0x21];
      fVar30 = pfVar42[0x22];
      fVar31 = pfVar42[0x23];
      fVar32 = pfVar42[0x3d];
      fVar33 = pfVar42[0x3e];
      fVar34 = pfVar42[0x3f];
      fVar35 = pfVar42[0x39];
      fVar36 = pfVar42[0x3a];
      fVar37 = pfVar42[0x3b];
      fVar65 = pfVar42[0x35];
      fVar53 = pfVar42[0x36];
      fVar52 = pfVar42[0x37];
      fVar56 = pfVar42[0x31];
      fVar55 = pfVar42[0x32];
      fVar59 = pfVar42[0x33];
      (pvVar44->field_0).v[0] =
           fVar94 * (fVar90 * pfVar42[0x30] +
                    fVar98 * pfVar42[0x34] + fVar54 * pfVar42[0x38] + fVar103 * pfVar42[0x3c]) +
           (pfVar42[0x20] * fVar90 + fVar75 * fVar98 + fVar77 * fVar54 + pfVar42[0x2c] * fVar103) *
           fVar57 + (pfVar42[0x10] * fVar90 +
                    fVar67 * fVar98 + fVar71 * fVar54 + pfVar42[0x1c] * fVar103) * fVar105 +
           (*pfVar42 * fVar90 + pfVar42[4] * fVar98 + pfVar42[8] * fVar54 + pfVar42[0xc] * fVar103)
           * fVar108;
      (pvVar44->field_0).v[1] =
           fVar94 * (fVar90 * fVar56 + fVar98 * fVar65 + fVar54 * fVar35 + fVar103 * fVar32) +
           (fVar29 * fVar90 + fVar93 * fVar98 + fVar81 * fVar54 + fVar26 * fVar103) * fVar57 +
           (fVar23 * fVar90 + fVar68 * fVar98 + fVar73 * fVar54 + fVar20 * fVar103) * fVar105 +
           (fVar17 * fVar90 + fVar14 * fVar98 + fVar11 * fVar54 + fVar84 * fVar103) * fVar108;
      (pvVar44->field_0).v[2] =
           fVar94 * (fVar90 * fVar55 + fVar98 * fVar53 + fVar54 * fVar36 + fVar103 * fVar33) +
           (fVar30 * fVar90 + fVar64 * fVar98 + fVar82 * fVar54 + fVar27 * fVar103) * fVar57 +
           (fVar24 * fVar90 + fVar69 * fVar98 + fVar74 * fVar54 + fVar21 * fVar103) * fVar105 +
           (fVar18 * fVar90 + fVar15 * fVar98 + fVar12 * fVar54 + fVar99 * fVar103) * fVar108;
      (pvVar44->field_0).v[3] =
           fVar94 * (fVar90 * fVar59 + fVar98 * fVar52 + fVar54 * fVar37 + fVar103 * fVar34) +
           (fVar31 * fVar90 + fVar58 * fVar98 + fVar76 * fVar54 + fVar28 * fVar103) * fVar57 +
           (fVar25 * fVar90 + fVar66 * fVar98 + fVar70 * fVar54 + fVar22 * fVar103) * fVar105 +
           (fVar19 * fVar90 + fVar16 * fVar98 + fVar13 * fVar54 + fVar102 * fVar103) * fVar108;
    }
    if (pvVar2 != (vfloat_impl<4> *)0x0) {
      fVar75 = pfVar42[0x14];
      fVar93 = pfVar42[0x15];
      fVar64 = pfVar42[0x16];
      fVar58 = pfVar42[0x17];
      fVar67 = pfVar42[0x18];
      fVar68 = pfVar42[0x19];
      fVar69 = pfVar42[0x1a];
      fVar66 = pfVar42[0x1b];
      fVar71 = pfVar42[0x24];
      fVar73 = pfVar42[0x25];
      fVar74 = pfVar42[0x26];
      fVar70 = pfVar42[0x27];
      fVar77 = pfVar42[0x28];
      fVar81 = pfVar42[0x29];
      fVar82 = pfVar42[0x2a];
      fVar76 = pfVar42[0x2b];
      if ((fVar83 != 1.0 && fVar83 != 0.0) && (fVar85 != 0.0 && fVar85 != 1.0)) {
        fVar84 = fVar85 + fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar99 = 1.0 - fVar83;
        fVar102 = 1.0 - fVar85;
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar75 = fVar84 * (pfVar42[0x40] * fVar83 + fVar75 * fVar85);
        fVar93 = fVar84 * (pfVar42[0x41] * fVar83 + fVar93 * fVar85);
        fVar64 = fVar84 * (pfVar42[0x42] * fVar83 + fVar64 * fVar85);
        fVar58 = fVar84 * (pfVar42[0x43] * fVar83 + fVar58 * fVar85);
        auVar60._4_4_ = fVar102;
        auVar60._0_4_ = fVar102;
        auVar60._8_4_ = fVar102;
        auVar60._12_4_ = fVar102;
        auVar61._4_12_ = auVar60._4_12_;
        auVar61._0_4_ = fVar102 + fVar83;
        auVar78._4_4_ = fVar102;
        auVar78._0_4_ = auVar61._0_4_;
        auVar78._8_4_ = fVar102;
        auVar78._12_4_ = fVar102;
        auVar86 = rcpss(auVar78,auVar61);
        fVar84 = (2.0 - auVar61._0_4_ * auVar86._0_4_) * auVar86._0_4_;
        fVar67 = fVar84 * (fVar83 * fVar67 + pfVar42[0x44] * fVar102);
        fVar68 = fVar84 * (fVar83 * fVar68 + pfVar42[0x45] * fVar102);
        fVar69 = fVar84 * (fVar83 * fVar69 + pfVar42[0x46] * fVar102);
        fVar66 = fVar84 * (fVar83 * fVar66 + pfVar42[0x47] * fVar102);
        fVar84 = (2.0 - fVar85) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar77 = fVar84 * (pfVar42[0x4c] * fVar99 + fVar102 * fVar77);
        fVar81 = fVar84 * (pfVar42[0x4d] * fVar99 + fVar102 * fVar81);
        fVar82 = fVar84 * (pfVar42[0x4e] * fVar99 + fVar102 * fVar82);
        fVar76 = fVar84 * (pfVar42[0x4f] * fVar99 + fVar102 * fVar76);
        fVar84 = (fVar85 + 1.0) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar71 = fVar84 * (fVar99 * fVar71 + fVar85 * pfVar42[0x48]);
        fVar73 = fVar84 * (fVar99 * fVar73 + fVar85 * pfVar42[0x49]);
        fVar74 = fVar84 * (fVar99 * fVar74 + fVar85 * pfVar42[0x4a]);
        fVar70 = fVar84 * (fVar99 * fVar70 + fVar85 * pfVar42[0x4b]);
      }
      auVar101._4_4_ = 1.0 - fVar85;
      fVar106 = 1.0 - fVar83;
      fVar54 = auVar101._4_4_ * auVar101._4_4_;
      fVar84 = fVar85 * auVar101._4_4_ + fVar85 * auVar101._4_4_;
      fVar90 = fVar85 * fVar85;
      fVar112 = fVar54 * -3.0;
      fVar111 = (fVar54 - fVar84) * 3.0;
      fVar110 = (fVar84 - fVar90) * 3.0;
      fVar94 = fVar90 * 3.0;
      fVar103 = fVar106 * fVar106;
      fVar84 = pfVar42[0xd];
      fVar99 = pfVar42[0xe];
      fVar102 = pfVar42[0xf];
      fVar11 = pfVar42[9];
      fVar12 = pfVar42[10];
      fVar13 = pfVar42[0xb];
      fVar14 = pfVar42[5];
      fVar15 = pfVar42[6];
      fVar16 = pfVar42[7];
      fVar17 = pfVar42[1];
      fVar18 = pfVar42[2];
      fVar19 = pfVar42[3];
      fVar108 = fVar106 * fVar103;
      fVar20 = pfVar42[0x1d];
      fVar21 = pfVar42[0x1e];
      fVar22 = pfVar42[0x1f];
      fVar95 = fVar83 * 3.0 * fVar103;
      fVar23 = pfVar42[0x11];
      fVar24 = pfVar42[0x12];
      fVar25 = pfVar42[0x13];
      fVar98 = fVar83 * fVar83;
      fVar26 = pfVar42[0x2d];
      fVar27 = pfVar42[0x2e];
      fVar28 = pfVar42[0x2f];
      fVar105 = fVar98 * 3.0;
      fVar29 = pfVar42[0x21];
      fVar30 = pfVar42[0x22];
      fVar31 = pfVar42[0x23];
      fVar100 = fVar106 * fVar105;
      fVar32 = pfVar42[0x3d];
      fVar33 = pfVar42[0x3e];
      fVar34 = pfVar42[0x3f];
      fVar35 = pfVar42[0x39];
      fVar36 = pfVar42[0x3a];
      fVar37 = pfVar42[0x3b];
      fVar65 = pfVar42[0x35];
      fVar53 = pfVar42[0x36];
      fVar52 = pfVar42[0x37];
      fVar56 = pfVar42[0x31];
      fVar55 = pfVar42[0x32];
      fVar59 = pfVar42[0x33];
      fVar57 = fVar83 * fVar98;
      (pvVar2->field_0).v[0] =
           (fVar57 * (fVar112 * pfVar42[0x30] +
                     fVar111 * pfVar42[0x34] + fVar110 * pfVar42[0x38] + fVar94 * pfVar42[0x3c]) +
            (pfVar42[0x20] * fVar112 + fVar71 * fVar111 + fVar77 * fVar110 + pfVar42[0x2c] * fVar94)
            * fVar100 +
            (pfVar42[0x10] * fVar112 + fVar75 * fVar111 + fVar67 * fVar110 + pfVar42[0x1c] * fVar94)
            * fVar95 +
           (*pfVar42 * fVar112 + pfVar42[4] * fVar111 + pfVar42[8] * fVar110 + pfVar42[0xc] * fVar94
           ) * fVar108) * dscale;
      (pvVar2->field_0).v[1] =
           (fVar57 * (fVar112 * fVar56 + fVar111 * fVar65 + fVar110 * fVar35 + fVar94 * fVar32) +
            (fVar29 * fVar112 + fVar73 * fVar111 + fVar81 * fVar110 + fVar26 * fVar94) * fVar100 +
            (fVar23 * fVar112 + fVar93 * fVar111 + fVar68 * fVar110 + fVar20 * fVar94) * fVar95 +
           (fVar17 * fVar112 + fVar14 * fVar111 + fVar11 * fVar110 + fVar84 * fVar94) * fVar108) *
           dscale;
      (pvVar2->field_0).v[2] =
           (fVar57 * (fVar112 * fVar55 + fVar111 * fVar53 + fVar110 * fVar36 + fVar94 * fVar33) +
            (fVar30 * fVar112 + fVar74 * fVar111 + fVar82 * fVar110 + fVar27 * fVar94) * fVar100 +
            (fVar24 * fVar112 + fVar64 * fVar111 + fVar69 * fVar110 + fVar21 * fVar94) * fVar95 +
           (fVar18 * fVar112 + fVar15 * fVar111 + fVar12 * fVar110 + fVar99 * fVar94) * fVar108) *
           dscale;
      (pvVar2->field_0).v[3] =
           (fVar57 * (fVar112 * fVar59 + fVar111 * fVar52 + fVar110 * fVar37 + fVar94 * fVar34) +
            (fVar31 * fVar112 + fVar70 * fVar111 + fVar76 * fVar110 + fVar28 * fVar94) * fVar100 +
            (fVar25 * fVar112 + fVar58 * fVar111 + fVar66 * fVar110 + fVar22 * fVar94) * fVar95 +
           (fVar19 * fVar112 + fVar16 * fVar111 + fVar13 * fVar110 + fVar102 * fVar94) * fVar108) *
           dscale;
      fVar75 = pfVar42[0x14];
      fVar93 = pfVar42[0x15];
      fVar64 = pfVar42[0x16];
      fVar58 = pfVar42[0x17];
      fVar67 = pfVar42[0x18];
      fVar68 = pfVar42[0x19];
      fVar69 = pfVar42[0x1a];
      fVar66 = pfVar42[0x1b];
      fVar71 = pfVar42[0x24];
      fVar73 = pfVar42[0x25];
      fVar74 = pfVar42[0x26];
      fVar70 = pfVar42[0x27];
      fVar77 = pfVar42[0x28];
      fVar81 = pfVar42[0x29];
      fVar82 = pfVar42[0x2a];
      fVar76 = pfVar42[0x2b];
      if ((fVar83 == 1.0 || fVar83 == 0.0) || (fVar85 == 0.0 || fVar85 == 1.0)) {
        auVar62._4_4_ = auVar101._4_4_;
        auVar62._0_4_ = auVar101._4_4_;
        auVar62._8_4_ = auVar101._4_4_;
        auVar62._12_4_ = auVar101._4_4_;
      }
      else {
        fVar84 = fVar85 + fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar75 = fVar84 * (pfVar42[0x40] * fVar83 + fVar75 * fVar85);
        fVar93 = fVar84 * (pfVar42[0x41] * fVar83 + fVar93 * fVar85);
        fVar64 = fVar84 * (pfVar42[0x42] * fVar83 + fVar64 * fVar85);
        fVar58 = fVar84 * (pfVar42[0x43] * fVar83 + fVar58 * fVar85);
        auVar62._4_4_ = auVar101._4_4_;
        auVar62._0_4_ = auVar101._4_4_;
        auVar62._8_4_ = auVar101._4_4_;
        auVar62._12_4_ = auVar101._4_4_;
        auVar97._4_12_ = auVar62._4_12_;
        auVar97._0_4_ = auVar101._4_4_ + fVar83;
        auVar101._0_4_ = auVar97._0_4_;
        auVar101._8_4_ = auVar101._4_4_;
        auVar101._12_4_ = auVar101._4_4_;
        auVar86 = rcpss(auVar101,auVar97);
        fVar84 = (2.0 - auVar97._0_4_ * auVar86._0_4_) * auVar86._0_4_;
        fVar67 = fVar84 * (fVar83 * fVar67 + pfVar42[0x44] * auVar101._4_4_);
        fVar68 = fVar84 * (fVar83 * fVar68 + pfVar42[0x45] * auVar101._4_4_);
        fVar69 = fVar84 * (fVar83 * fVar69 + pfVar42[0x46] * auVar101._4_4_);
        fVar66 = fVar84 * (fVar83 * fVar66 + pfVar42[0x47] * auVar101._4_4_);
        fVar84 = (2.0 - fVar85) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar77 = fVar84 * (pfVar42[0x4c] * fVar106 + fVar77 * auVar101._4_4_);
        fVar81 = fVar84 * (pfVar42[0x4d] * fVar106 + fVar81 * auVar101._4_4_);
        fVar82 = fVar84 * (pfVar42[0x4e] * fVar106 + fVar82 * auVar101._4_4_);
        fVar76 = fVar84 * (pfVar42[0x4f] * fVar106 + fVar76 * auVar101._4_4_);
        fVar84 = (fVar85 + 1.0) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar71 = fVar84 * (fVar106 * fVar71 + fVar85 * pfVar42[0x48]);
        fVar73 = fVar84 * (fVar106 * fVar73 + fVar85 * pfVar42[0x49]);
        fVar74 = fVar84 * (fVar106 * fVar74 + fVar85 * pfVar42[0x4a]);
        fVar70 = fVar84 * (fVar106 * fVar70 + fVar85 * pfVar42[0x4b]);
      }
      fVar57 = auVar62._0_4_ * fVar54;
      fVar54 = fVar85 * 3.0 * fVar54;
      fVar94 = fVar94 * auVar62._0_4_;
      fVar90 = fVar90 * fVar85;
      fVar84 = fVar83 * fVar106 + fVar83 * fVar106;
      fVar95 = (fVar103 - fVar84) * 3.0;
      fVar108 = (fVar84 - fVar98) * 3.0;
      fVar84 = pfVar42[0xd];
      fVar99 = pfVar42[0xe];
      fVar102 = pfVar42[0xf];
      fVar11 = pfVar42[9];
      fVar12 = pfVar42[10];
      fVar13 = pfVar42[0xb];
      fVar14 = pfVar42[5];
      fVar15 = pfVar42[6];
      fVar16 = pfVar42[7];
      fVar17 = pfVar42[1];
      fVar18 = pfVar42[2];
      fVar19 = pfVar42[3];
      fVar103 = fVar103 * -3.0;
      fVar20 = pfVar42[0x1d];
      fVar21 = pfVar42[0x1e];
      fVar22 = pfVar42[0x1f];
      fVar23 = pfVar42[0x11];
      fVar24 = pfVar42[0x12];
      fVar25 = pfVar42[0x13];
      fVar26 = pfVar42[0x2d];
      fVar27 = pfVar42[0x2e];
      fVar28 = pfVar42[0x2f];
      fVar29 = pfVar42[0x21];
      fVar30 = pfVar42[0x22];
      fVar31 = pfVar42[0x23];
      fVar32 = pfVar42[0x3d];
      fVar33 = pfVar42[0x3e];
      fVar34 = pfVar42[0x3f];
      fVar35 = pfVar42[0x39];
      fVar36 = pfVar42[0x3a];
      fVar37 = pfVar42[0x3b];
      fVar65 = pfVar42[0x35];
      fVar53 = pfVar42[0x36];
      fVar52 = pfVar42[0x37];
      fVar56 = pfVar42[0x31];
      fVar55 = pfVar42[0x32];
      fVar59 = pfVar42[0x33];
      (pvVar3->field_0).v[0] =
           dscale * (fVar105 * (fVar57 * pfVar42[0x30] +
                               fVar54 * pfVar42[0x34] +
                               fVar94 * pfVar42[0x38] + fVar90 * pfVar42[0x3c]) +
                     (pfVar42[0x20] * fVar57 +
                     fVar71 * fVar54 + fVar77 * fVar94 + pfVar42[0x2c] * fVar90) * fVar108 +
                     (pfVar42[0x10] * fVar57 +
                     fVar75 * fVar54 + fVar67 * fVar94 + pfVar42[0x1c] * fVar90) * fVar95 +
                    (*pfVar42 * fVar57 +
                    pfVar42[4] * fVar54 + pfVar42[8] * fVar94 + pfVar42[0xc] * fVar90) * fVar103);
      (pvVar3->field_0).v[1] =
           dscale * (fVar105 * (fVar57 * fVar56 +
                               fVar54 * fVar65 + fVar94 * fVar35 + fVar90 * fVar32) +
                     (fVar29 * fVar57 + fVar73 * fVar54 + fVar81 * fVar94 + fVar26 * fVar90) *
                     fVar108 + (fVar23 * fVar57 +
                               fVar93 * fVar54 + fVar68 * fVar94 + fVar20 * fVar90) * fVar95 +
                    (fVar17 * fVar57 + fVar14 * fVar54 + fVar11 * fVar94 + fVar84 * fVar90) *
                    fVar103);
      (pvVar3->field_0).v[2] =
           dscale * (fVar105 * (fVar57 * fVar55 +
                               fVar54 * fVar53 + fVar94 * fVar36 + fVar90 * fVar33) +
                     (fVar30 * fVar57 + fVar74 * fVar54 + fVar82 * fVar94 + fVar27 * fVar90) *
                     fVar108 + (fVar24 * fVar57 +
                               fVar64 * fVar54 + fVar69 * fVar94 + fVar21 * fVar90) * fVar95 +
                    (fVar18 * fVar57 + fVar15 * fVar54 + fVar12 * fVar94 + fVar99 * fVar90) *
                    fVar103);
      (pvVar3->field_0).v[3] =
           dscale * (fVar105 * (fVar57 * fVar59 +
                               fVar54 * fVar52 + fVar94 * fVar37 + fVar90 * fVar34) +
                     (fVar31 * fVar57 + fVar70 * fVar54 + fVar76 * fVar94 + fVar28 * fVar90) *
                     fVar108 + (fVar25 * fVar57 +
                               fVar58 * fVar54 + fVar66 * fVar94 + fVar22 * fVar90) * fVar95 +
                    (fVar19 * fVar57 + fVar16 * fVar54 + fVar13 * fVar94 + fVar102 * fVar90) *
                    fVar103);
    }
    bVar40 = true;
    if (pvVar4 != (vfloat_impl<4> *)0x0) {
      bVar9 = fVar85 != 1.0;
      bVar10 = fVar85 != 0.0;
      bVar7 = fVar83 != 0.0;
      bVar8 = fVar83 != 1.0;
      fVar75 = pfVar42[0x14];
      fVar93 = pfVar42[0x15];
      fVar64 = pfVar42[0x16];
      fVar58 = pfVar42[0x17];
      fVar67 = pfVar42[0x18];
      fVar68 = pfVar42[0x19];
      fVar69 = pfVar42[0x1a];
      fVar66 = pfVar42[0x1b];
      fVar71 = pfVar42[0x24];
      fVar73 = pfVar42[0x25];
      fVar74 = pfVar42[0x26];
      fVar70 = pfVar42[0x27];
      fVar77 = pfVar42[0x28];
      fVar81 = pfVar42[0x29];
      fVar82 = pfVar42[0x2a];
      fVar76 = pfVar42[0x2b];
      if ((bVar8 && bVar7) && (bVar10 && bVar9)) {
        fVar84 = fVar85 + fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar99 = 1.0 - fVar83;
        fVar102 = 1.0 - fVar85;
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar75 = fVar84 * (pfVar42[0x40] * fVar83 + fVar75 * fVar85);
        fVar93 = fVar84 * (pfVar42[0x41] * fVar83 + fVar93 * fVar85);
        fVar64 = fVar84 * (pfVar42[0x42] * fVar83 + fVar64 * fVar85);
        fVar58 = fVar84 * (pfVar42[0x43] * fVar83 + fVar58 * fVar85);
        auVar79._4_4_ = fVar102;
        auVar79._0_4_ = fVar102;
        auVar79._8_4_ = fVar102;
        auVar79._12_4_ = fVar102;
        auVar80._4_12_ = auVar79._4_12_;
        auVar80._0_4_ = fVar102 + fVar83;
        auVar87._4_4_ = fVar102;
        auVar87._0_4_ = auVar80._0_4_;
        auVar87._8_4_ = fVar102;
        auVar87._12_4_ = fVar102;
        auVar86 = rcpss(auVar87,auVar80);
        fVar84 = (2.0 - auVar80._0_4_ * auVar86._0_4_) * auVar86._0_4_;
        fVar67 = fVar84 * (fVar83 * fVar67 + pfVar42[0x44] * fVar102);
        fVar68 = fVar84 * (fVar83 * fVar68 + pfVar42[0x45] * fVar102);
        fVar69 = fVar84 * (fVar83 * fVar69 + pfVar42[0x46] * fVar102);
        fVar66 = fVar84 * (fVar83 * fVar66 + pfVar42[0x47] * fVar102);
        fVar84 = (2.0 - fVar85) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar77 = fVar84 * (pfVar42[0x4c] * fVar99 + fVar102 * fVar77);
        fVar81 = fVar84 * (pfVar42[0x4d] * fVar99 + fVar102 * fVar81);
        fVar82 = fVar84 * (pfVar42[0x4e] * fVar99 + fVar102 * fVar82);
        fVar76 = fVar84 * (pfVar42[0x4f] * fVar99 + fVar102 * fVar76);
        fVar84 = (fVar85 + 1.0) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar71 = fVar84 * (fVar99 * fVar71 + fVar85 * pfVar42[0x48]);
        fVar73 = fVar84 * (fVar99 * fVar73 + fVar85 * pfVar42[0x49]);
        fVar74 = fVar84 * (fVar99 * fVar74 + fVar85 * pfVar42[0x4a]);
        fVar70 = fVar84 * (fVar99 * fVar70 + fVar85 * pfVar42[0x4b]);
      }
      fVar100 = 1.0 - fVar85;
      fVar95 = 1.0 - fVar83;
      fVar106 = fVar100 * 6.0;
      fVar98 = (fVar85 - (fVar100 + fVar100)) * 6.0;
      fVar110 = (fVar100 - (fVar85 + fVar85)) * 6.0;
      fVar54 = fVar85 * 6.0;
      fVar111 = fVar95 * fVar95;
      fVar84 = pfVar42[0xd];
      fVar99 = pfVar42[0xe];
      fVar102 = pfVar42[0xf];
      fVar11 = pfVar42[9];
      fVar12 = pfVar42[10];
      fVar13 = pfVar42[0xb];
      fVar14 = pfVar42[5];
      fVar15 = pfVar42[6];
      fVar16 = pfVar42[7];
      fVar17 = pfVar42[1];
      fVar18 = pfVar42[2];
      fVar19 = pfVar42[3];
      fVar90 = fVar95 * fVar111;
      fVar20 = pfVar42[0x1d];
      fVar21 = pfVar42[0x1e];
      fVar22 = pfVar42[0x1f];
      fVar103 = fVar83 * 3.0 * fVar111;
      fVar23 = pfVar42[0x11];
      fVar24 = pfVar42[0x12];
      fVar25 = pfVar42[0x13];
      fVar112 = fVar83 * fVar83;
      fVar26 = pfVar42[0x2d];
      fVar27 = pfVar42[0x2e];
      fVar28 = pfVar42[0x2f];
      fVar94 = fVar112 * 3.0;
      fVar29 = pfVar42[0x21];
      fVar30 = pfVar42[0x22];
      fVar31 = pfVar42[0x23];
      fVar105 = fVar95 * fVar94;
      fVar32 = pfVar42[0x3d];
      fVar33 = pfVar42[0x3e];
      fVar34 = pfVar42[0x3f];
      fVar35 = pfVar42[0x39];
      fVar36 = pfVar42[0x3a];
      fVar37 = pfVar42[0x3b];
      fVar65 = pfVar42[0x35];
      fVar53 = pfVar42[0x36];
      fVar52 = pfVar42[0x37];
      fVar56 = pfVar42[0x31];
      fVar55 = pfVar42[0x32];
      fVar59 = pfVar42[0x33];
      fVar57 = fVar83 * fVar112;
      fVar108 = dscale * dscale;
      (pvVar4->field_0).v[0] =
           (fVar57 * (fVar106 * pfVar42[0x30] +
                     fVar98 * pfVar42[0x34] + fVar110 * pfVar42[0x38] + fVar54 * pfVar42[0x3c]) +
            (pfVar42[0x20] * fVar106 + fVar71 * fVar98 + fVar77 * fVar110 + pfVar42[0x2c] * fVar54)
            * fVar105 +
            (pfVar42[0x10] * fVar106 + fVar75 * fVar98 + fVar67 * fVar110 + pfVar42[0x1c] * fVar54)
            * fVar103 +
           (*pfVar42 * fVar106 + pfVar42[4] * fVar98 + pfVar42[8] * fVar110 + pfVar42[0xc] * fVar54)
           * fVar90) * fVar108;
      (pvVar4->field_0).v[1] =
           (fVar57 * (fVar106 * fVar56 + fVar98 * fVar65 + fVar110 * fVar35 + fVar54 * fVar32) +
            (fVar29 * fVar106 + fVar73 * fVar98 + fVar81 * fVar110 + fVar26 * fVar54) * fVar105 +
            (fVar23 * fVar106 + fVar93 * fVar98 + fVar68 * fVar110 + fVar20 * fVar54) * fVar103 +
           (fVar17 * fVar106 + fVar14 * fVar98 + fVar11 * fVar110 + fVar84 * fVar54) * fVar90) *
           fVar108;
      (pvVar4->field_0).v[2] =
           (fVar57 * (fVar106 * fVar55 + fVar98 * fVar53 + fVar110 * fVar36 + fVar54 * fVar33) +
            (fVar30 * fVar106 + fVar74 * fVar98 + fVar82 * fVar110 + fVar27 * fVar54) * fVar105 +
            (fVar24 * fVar106 + fVar64 * fVar98 + fVar69 * fVar110 + fVar21 * fVar54) * fVar103 +
           (fVar18 * fVar106 + fVar15 * fVar98 + fVar12 * fVar110 + fVar99 * fVar54) * fVar90) *
           fVar108;
      (pvVar4->field_0).v[3] =
           (fVar57 * (fVar106 * fVar59 + fVar98 * fVar52 + fVar110 * fVar37 + fVar54 * fVar34) +
            (fVar31 * fVar106 + fVar70 * fVar98 + fVar76 * fVar110 + fVar28 * fVar54) * fVar105 +
            (fVar25 * fVar106 + fVar58 * fVar98 + fVar66 * fVar110 + fVar22 * fVar54) * fVar103 +
           (fVar19 * fVar106 + fVar16 * fVar98 + fVar13 * fVar110 + fVar102 * fVar54) * fVar90) *
           fVar108;
      fVar75 = pfVar42[0x14];
      fVar93 = pfVar42[0x15];
      fVar64 = pfVar42[0x16];
      fVar58 = pfVar42[0x17];
      fVar67 = pfVar42[0x18];
      fVar68 = pfVar42[0x19];
      fVar69 = pfVar42[0x1a];
      fVar66 = pfVar42[0x1b];
      fVar71 = pfVar42[0x24];
      fVar73 = pfVar42[0x25];
      fVar74 = pfVar42[0x26];
      fVar70 = pfVar42[0x27];
      fVar77 = pfVar42[0x28];
      fVar81 = pfVar42[0x29];
      fVar82 = pfVar42[0x2a];
      fVar76 = pfVar42[0x2b];
      if ((bVar8 && bVar7) && (bVar10 && bVar9)) {
        fVar84 = fVar85 + fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar75 = fVar84 * (pfVar42[0x40] * fVar83 + fVar75 * fVar85);
        fVar93 = fVar84 * (pfVar42[0x41] * fVar83 + fVar93 * fVar85);
        fVar64 = fVar84 * (pfVar42[0x42] * fVar83 + fVar64 * fVar85);
        fVar58 = fVar84 * (pfVar42[0x43] * fVar83 + fVar58 * fVar85);
        auVar88._4_4_ = fVar100;
        auVar88._0_4_ = fVar100;
        auVar88._8_4_ = fVar100;
        auVar88._12_4_ = fVar100;
        auVar89._4_12_ = auVar88._4_12_;
        auVar89._0_4_ = fVar100 + fVar83;
        auVar92._4_4_ = fVar100;
        auVar92._0_4_ = auVar89._0_4_;
        auVar92._8_4_ = fVar100;
        auVar92._12_4_ = fVar100;
        auVar86 = rcpss(auVar92,auVar89);
        fVar84 = (2.0 - auVar89._0_4_ * auVar86._0_4_) * auVar86._0_4_;
        fVar67 = fVar84 * (fVar83 * fVar67 + pfVar42[0x44] * fVar100);
        fVar68 = fVar84 * (fVar83 * fVar68 + pfVar42[0x45] * fVar100);
        fVar69 = fVar84 * (fVar83 * fVar69 + pfVar42[0x46] * fVar100);
        fVar66 = fVar84 * (fVar83 * fVar66 + pfVar42[0x47] * fVar100);
        fVar84 = (2.0 - fVar85) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar77 = fVar84 * (pfVar42[0x4c] * fVar95 + fVar77 * fVar100);
        fVar81 = fVar84 * (pfVar42[0x4d] * fVar95 + fVar81 * fVar100);
        fVar82 = fVar84 * (pfVar42[0x4e] * fVar95 + fVar82 * fVar100);
        fVar76 = fVar84 * (pfVar42[0x4f] * fVar95 + fVar76 * fVar100);
        fVar84 = (fVar85 + 1.0) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar71 = (fVar71 * fVar95 + fVar85 * pfVar42[0x48]) * fVar84;
        fVar73 = (fVar73 * fVar95 + fVar85 * pfVar42[0x49]) * fVar84;
        fVar74 = (fVar74 * fVar95 + fVar85 * pfVar42[0x4a]) * fVar84;
        fVar70 = (fVar70 * fVar95 + fVar85 * pfVar42[0x4b]) * fVar84;
      }
      fVar110 = fVar100 * fVar100;
      fVar103 = fVar100 * fVar110;
      fVar54 = fVar85 * 3.0 * fVar110;
      fVar107 = fVar85 * fVar85;
      fVar90 = fVar107 * 3.0;
      fVar57 = fVar100 * fVar90;
      fVar105 = fVar85 * fVar107;
      fVar84 = pfVar42[0xd];
      fVar99 = pfVar42[0xe];
      fVar102 = pfVar42[0xf];
      fVar11 = pfVar42[9];
      fVar12 = pfVar42[10];
      fVar13 = pfVar42[0xb];
      fVar14 = pfVar42[5];
      fVar15 = pfVar42[6];
      fVar16 = pfVar42[7];
      fVar17 = pfVar42[1];
      fVar18 = pfVar42[2];
      fVar19 = pfVar42[3];
      fVar104 = fVar95 * 6.0;
      fVar20 = pfVar42[0x1d];
      fVar21 = pfVar42[0x1e];
      fVar22 = pfVar42[0x1f];
      fVar23 = pfVar42[0x11];
      fVar24 = pfVar42[0x12];
      fVar25 = pfVar42[0x13];
      fVar109 = (fVar83 - (fVar95 + fVar95)) * 6.0;
      fVar26 = pfVar42[0x2d];
      fVar27 = pfVar42[0x2e];
      fVar28 = pfVar42[0x2f];
      fVar29 = pfVar42[0x21];
      fVar30 = pfVar42[0x22];
      fVar31 = pfVar42[0x23];
      fVar98 = (fVar95 - (fVar83 + fVar83)) * 6.0;
      fVar32 = pfVar42[0x3d];
      fVar33 = pfVar42[0x3e];
      fVar34 = pfVar42[0x3f];
      fVar35 = pfVar42[0x39];
      fVar36 = pfVar42[0x3a];
      fVar37 = pfVar42[0x3b];
      fVar65 = pfVar42[0x35];
      fVar53 = pfVar42[0x36];
      fVar52 = pfVar42[0x37];
      fVar56 = pfVar42[0x31];
      fVar55 = pfVar42[0x32];
      fVar59 = pfVar42[0x33];
      fVar106 = fVar83 * 6.0;
      (pvVar5->field_0).v[0] =
           (fVar106 * (fVar103 * pfVar42[0x30] +
                      fVar54 * pfVar42[0x34] + fVar57 * pfVar42[0x38] + fVar105 * pfVar42[0x3c]) +
            (pfVar42[0x20] * fVar103 + fVar71 * fVar54 + fVar77 * fVar57 + pfVar42[0x2c] * fVar105)
            * fVar98 +
            (pfVar42[0x10] * fVar103 + fVar75 * fVar54 + fVar67 * fVar57 + pfVar42[0x1c] * fVar105)
            * fVar109 +
           (*pfVar42 * fVar103 + pfVar42[4] * fVar54 + pfVar42[8] * fVar57 + pfVar42[0xc] * fVar105)
           * fVar104) * fVar108;
      (pvVar5->field_0).v[1] =
           (fVar106 * (fVar103 * fVar56 + fVar54 * fVar65 + fVar57 * fVar35 + fVar105 * fVar32) +
            (fVar29 * fVar103 + fVar73 * fVar54 + fVar81 * fVar57 + fVar26 * fVar105) * fVar98 +
            (fVar23 * fVar103 + fVar93 * fVar54 + fVar68 * fVar57 + fVar20 * fVar105) * fVar109 +
           (fVar17 * fVar103 + fVar14 * fVar54 + fVar11 * fVar57 + fVar84 * fVar105) * fVar104) *
           fVar108;
      (pvVar5->field_0).v[2] =
           (fVar106 * (fVar103 * fVar55 + fVar54 * fVar53 + fVar57 * fVar36 + fVar105 * fVar33) +
            (fVar30 * fVar103 + fVar74 * fVar54 + fVar82 * fVar57 + fVar27 * fVar105) * fVar98 +
            (fVar24 * fVar103 + fVar64 * fVar54 + fVar69 * fVar57 + fVar21 * fVar105) * fVar109 +
           (fVar18 * fVar103 + fVar15 * fVar54 + fVar12 * fVar57 + fVar99 * fVar105) * fVar104) *
           fVar108;
      (pvVar5->field_0).v[3] =
           (fVar106 * (fVar103 * fVar59 + fVar54 * fVar52 + fVar57 * fVar37 + fVar105 * fVar34) +
            (fVar31 * fVar103 + fVar70 * fVar54 + fVar76 * fVar57 + fVar28 * fVar105) * fVar98 +
            (fVar25 * fVar103 + fVar58 * fVar54 + fVar66 * fVar57 + fVar22 * fVar105) * fVar109 +
           (fVar19 * fVar103 + fVar16 * fVar54 + fVar13 * fVar57 + fVar102 * fVar105) * fVar104) *
           fVar108;
      fVar75 = pfVar42[0x14];
      fVar93 = pfVar42[0x15];
      fVar64 = pfVar42[0x16];
      fVar58 = pfVar42[0x17];
      fVar67 = pfVar42[0x18];
      fVar68 = pfVar42[0x19];
      fVar69 = pfVar42[0x1a];
      fVar66 = pfVar42[0x1b];
      fVar71 = pfVar42[0x24];
      fVar73 = pfVar42[0x25];
      fVar74 = pfVar42[0x26];
      fVar70 = pfVar42[0x27];
      fVar77 = pfVar42[0x28];
      fVar81 = pfVar42[0x29];
      fVar82 = pfVar42[0x2a];
      fVar76 = pfVar42[0x2b];
      if ((bVar8 && bVar7) && (bVar10 && bVar9)) {
        fVar84 = fVar85 + fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar75 = fVar84 * (pfVar42[0x40] * fVar83 + fVar75 * fVar85);
        fVar93 = fVar84 * (pfVar42[0x41] * fVar83 + fVar93 * fVar85);
        fVar64 = fVar84 * (pfVar42[0x42] * fVar83 + fVar64 * fVar85);
        fVar58 = fVar84 * (pfVar42[0x43] * fVar83 + fVar58 * fVar85);
        auVar39._4_4_ = fVar100;
        auVar39._0_4_ = fVar100;
        auVar39._8_4_ = fVar100;
        auVar39._12_4_ = fVar100;
        auVar63._4_12_ = auVar39._4_12_;
        auVar63._0_4_ = fVar100 + fVar83;
        auVar72._4_4_ = fVar100;
        auVar72._0_4_ = auVar63._0_4_;
        auVar72._8_4_ = fVar100;
        auVar72._12_4_ = fVar100;
        auVar86 = rcpss(auVar72,auVar63);
        fVar84 = (2.0 - auVar63._0_4_ * auVar86._0_4_) * auVar86._0_4_;
        fVar67 = fVar84 * (fVar83 * fVar67 + pfVar42[0x44] * fVar100);
        fVar68 = fVar84 * (fVar83 * fVar68 + pfVar42[0x45] * fVar100);
        fVar69 = fVar84 * (fVar83 * fVar69 + pfVar42[0x46] * fVar100);
        fVar66 = fVar84 * (fVar83 * fVar66 + pfVar42[0x47] * fVar100);
        fVar84 = (2.0 - fVar85) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar77 = fVar84 * (pfVar42[0x4c] * fVar95 + fVar77 * fVar100);
        fVar81 = fVar84 * (pfVar42[0x4d] * fVar95 + fVar81 * fVar100);
        fVar82 = fVar84 * (pfVar42[0x4e] * fVar95 + fVar82 * fVar100);
        fVar76 = fVar84 * (pfVar42[0x4f] * fVar95 + fVar76 * fVar100);
        fVar84 = (fVar85 + 1.0) - fVar83;
        auVar86 = rcpss(ZEXT416((uint)fVar84),ZEXT416((uint)fVar84));
        fVar84 = (2.0 - fVar84 * auVar86._0_4_) * auVar86._0_4_;
        fVar71 = (fVar71 * fVar95 + fVar85 * pfVar42[0x48]) * fVar84;
        fVar73 = (fVar73 * fVar95 + fVar85 * pfVar42[0x49]) * fVar84;
        fVar74 = (fVar74 * fVar95 + fVar85 * pfVar42[0x4a]) * fVar84;
        fVar70 = (fVar70 * fVar95 + fVar85 * pfVar42[0x4b]) * fVar84;
      }
      fVar85 = fVar85 * fVar100 + fVar85 * fVar100;
      fVar98 = fVar110 * -3.0;
      fVar55 = (fVar110 - fVar85) * 3.0;
      fVar54 = (fVar85 - fVar107) * 3.0;
      fVar85 = fVar83 * fVar95 + fVar83 * fVar95;
      fVar57 = fVar111 * -3.0;
      fVar59 = (fVar111 - fVar85) * 3.0;
      fVar103 = (fVar85 - fVar112) * 3.0;
      fVar85 = pfVar42[0xd];
      fVar83 = pfVar42[0xe];
      fVar84 = pfVar42[0xf];
      fVar99 = pfVar42[9];
      fVar102 = pfVar42[10];
      fVar11 = pfVar42[0xb];
      fVar12 = pfVar42[5];
      fVar13 = pfVar42[6];
      fVar14 = pfVar42[7];
      fVar15 = pfVar42[1];
      fVar16 = pfVar42[2];
      fVar17 = pfVar42[3];
      fVar18 = pfVar42[0x1d];
      fVar19 = pfVar42[0x1e];
      fVar20 = pfVar42[0x1f];
      fVar21 = pfVar42[0x11];
      fVar22 = pfVar42[0x12];
      fVar23 = pfVar42[0x13];
      fVar24 = pfVar42[0x2d];
      fVar25 = pfVar42[0x2e];
      fVar26 = pfVar42[0x2f];
      fVar27 = pfVar42[0x21];
      fVar28 = pfVar42[0x22];
      fVar29 = pfVar42[0x23];
      fVar30 = pfVar42[0x3d];
      fVar31 = pfVar42[0x3e];
      fVar32 = pfVar42[0x3f];
      fVar33 = pfVar42[0x39];
      fVar34 = pfVar42[0x3a];
      fVar35 = pfVar42[0x3b];
      fVar36 = pfVar42[0x35];
      fVar37 = pfVar42[0x36];
      fVar65 = pfVar42[0x37];
      fVar53 = pfVar42[0x31];
      fVar52 = pfVar42[0x32];
      fVar56 = pfVar42[0x33];
      (pvVar6->field_0).v[0] =
           fVar108 * (fVar94 * (fVar98 * pfVar42[0x30] +
                               fVar55 * pfVar42[0x34] +
                               fVar54 * pfVar42[0x38] + fVar90 * pfVar42[0x3c]) +
                      (pfVar42[0x20] * fVar98 +
                      fVar71 * fVar55 + fVar77 * fVar54 + pfVar42[0x2c] * fVar90) * fVar103 +
                      (pfVar42[0x10] * fVar98 +
                      fVar75 * fVar55 + fVar67 * fVar54 + pfVar42[0x1c] * fVar90) * fVar59 +
                     (*pfVar42 * fVar98 +
                     pfVar42[4] * fVar55 + pfVar42[8] * fVar54 + pfVar42[0xc] * fVar90) * fVar57);
      (pvVar6->field_0).v[1] =
           fVar108 * (fVar94 * (fVar98 * fVar53 +
                               fVar55 * fVar36 + fVar54 * fVar33 + fVar90 * fVar30) +
                      (fVar27 * fVar98 + fVar73 * fVar55 + fVar81 * fVar54 + fVar24 * fVar90) *
                      fVar103 + (fVar21 * fVar98 +
                                fVar93 * fVar55 + fVar68 * fVar54 + fVar18 * fVar90) * fVar59 +
                     (fVar15 * fVar98 + fVar12 * fVar55 + fVar99 * fVar54 + fVar85 * fVar90) *
                     fVar57);
      (pvVar6->field_0).v[2] =
           fVar108 * (fVar94 * (fVar98 * fVar52 +
                               fVar55 * fVar37 + fVar54 * fVar34 + fVar90 * fVar31) +
                      (fVar28 * fVar98 + fVar74 * fVar55 + fVar82 * fVar54 + fVar25 * fVar90) *
                      fVar103 + (fVar22 * fVar98 +
                                fVar64 * fVar55 + fVar69 * fVar54 + fVar19 * fVar90) * fVar59 +
                     (fVar16 * fVar98 + fVar13 * fVar55 + fVar102 * fVar54 + fVar83 * fVar90) *
                     fVar57);
      (pvVar6->field_0).v[3] =
           fVar108 * (fVar94 * (fVar98 * fVar56 +
                               fVar55 * fVar65 + fVar54 * fVar35 + fVar90 * fVar32) +
                      (fVar29 * fVar98 + fVar70 * fVar55 + fVar76 * fVar54 + fVar26 * fVar90) *
                      fVar103 + (fVar23 * fVar98 +
                                fVar58 * fVar55 + fVar66 * fVar54 + fVar20 * fVar90) * fVar59 +
                     (fVar17 * fVar98 + fVar14 * fVar55 + fVar11 * fVar54 + fVar84 * fVar90) *
                     fVar57);
    }
    break;
  case 7:
    bVar40 = eval_general(this,(SubdividedGeneralPatch *)(This.ptr & 0xfffffffffffffff0),*u,*v,depth
                         );
    break;
  case 8:
    psVar47 = (size_t *)(This.ptr & 0xfffffffffffffff0);
    local_d80.items[0].border_index = (int)*u;
    local_e54 = *v;
    if (0.5 <= local_e54) {
      local_e54 = local_e54 + local_e54 + -1.0;
      if ((float)local_d80.items[0].border_index <= 0.5) {
        This_00.ptr = psVar47[3];
        local_d80.items[0].border_index =
             (int)((float)local_d80.items[0].border_index + (float)local_d80.items[0].border_index);
      }
      else {
        This_00.ptr = psVar47[2];
        local_d80.items[0].border_index =
             (int)((float)local_d80.items[0].border_index + (float)local_d80.items[0].border_index +
                  -1.0);
      }
    }
    else {
      if (0.5 <= (float)local_d80.items[0].border_index) {
        local_d80.items[0].border_index =
             (int)((float)local_d80.items[0].border_index + (float)local_d80.items[0].border_index +
                  -1.0);
        This_00.ptr = psVar47[1];
      }
      else {
        This_00.ptr = *psVar47;
        local_d80.items[0].border_index =
             (int)((float)local_d80.items[0].border_index + (float)local_d80.items[0].border_index);
      }
      local_e54 = local_e54 + local_e54;
    }
    bVar40 = eval(this,This_00,(float *)&local_d80,&local_e54,dscale + dscale,depth + 1);
    break;
  case 9:
    uStack_de8 = local_df0;
    local_df0 = u;
    local_e40 = dscale;
    local_e00 = this;
    local_de0 = v;
    local_e10 = depth;
    array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    array_t(&local_d80);
    uVar48 = This.ptr & 0xfffffffffffffff0;
    pDVar45 = &local_d80.items[0].crease_weight;
    pDVar46 = &local_d80.items[0].ring;
    lVar50 = 0;
    for (lVar51 = 0; lVar51 != 4; lVar51 = lVar51 + 1) {
      local_e20 = pDVar46;
      local_e50 = pDVar45;
      local_d80.items[lVar51].border_index = *(int *)(uVar48 + lVar50);
      uVar41 = *(uint *)(uVar48 + 4 + lVar50);
      local_d80.items[lVar51].face_valence = uVar41;
      local_d80.items[lVar51].edge_valence = uVar41 * 2;
      local_d80.items[lVar51].vertex_crease_weight = *(float *)(uVar48 + 8 + lVar50);
      lVar50 = lVar50 + 0xc;
      for (uVar49 = 0; uVar49 < uVar41; uVar49 = uVar49 + 1) {
        pfVar42 = local_d80.items[lVar51].crease_weight.data;
        if ((0xf < uVar49) &&
           ((DynamicStackArray<float,_16UL,_64UL> *)pfVar42 ==
            &local_d80.items[lVar51].crease_weight)) {
          pfVar42 = (float *)operator_new__(0x100);
          local_d80.items[lVar51].crease_weight.data = pfVar42;
          for (lVar43 = 0; lVar43 != 0x10; lVar43 = lVar43 + 1) {
            local_d80.items[lVar51].crease_weight.data[lVar43] =
                 *(float *)((long)local_e50 + lVar43 * 4);
          }
          pfVar42 = local_d80.items[lVar51].crease_weight.data;
        }
        pfVar42[uVar49] = *(float *)(uVar48 + lVar50);
        lVar50 = lVar50 + 4;
        uVar41 = local_d80.items[lVar51].face_valence;
      }
      local_d80.items[lVar51].vertex_level = *(float *)(uVar48 + lVar50);
      local_d80.items[lVar51].edge_level = *(float *)(uVar48 + 4 + lVar50);
      local_d80.items[lVar51].eval_start_index = *(uint *)(uVar48 + 8 + lVar50);
      local_d80.items[lVar51].eval_unique_identifier = *(uint *)(uVar48 + 0xc + lVar50);
      puVar1 = (undefined8 *)(uVar48 + 0x10 + lVar50);
      uVar38 = puVar1[1];
      *(undefined8 *)&local_d80.items[lVar51].vtx.field_0 = *puVar1;
      *(undefined8 *)((long)&local_d80.items[lVar51].vtx.field_0 + 8) = uVar38;
      lVar50 = lVar50 + 0x20;
      local_e30 = &local_d80.items[lVar51].ring;
      for (uVar49 = 0; uVar49 < local_d80.items[lVar51].edge_valence; uVar49 = uVar49 + 1) {
        auVar86 = *(undefined1 (*) [16])(uVar48 + lVar50);
        pvVar44 = local_d80.items[lVar51].ring.data;
        if ((0x1f < uVar49) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar44 == local_e30)) {
          pvVar44 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          local_d80.items[lVar51].ring.data = pvVar44;
          for (lVar43 = 0; lVar43 != 0x200; lVar43 = lVar43 + 0x10) {
            uVar38 = ((undefined8 *)((long)local_e20 + lVar43))[1];
            puVar1 = (undefined8 *)((long)&(local_d80.items[lVar51].ring.data)->field_0 + lVar43);
            *puVar1 = *(undefined8 *)((long)local_e20 + lVar43);
            puVar1[1] = uVar38;
          }
          pvVar44 = local_d80.items[lVar51].ring.data;
        }
        local_e70 = auVar86._0_8_;
        uStack_e68 = auVar86._8_8_;
        *(undefined8 *)&pvVar44[uVar49].field_0 = local_e70;
        *(undefined8 *)((long)&pvVar44[uVar49].field_0 + 8) = uStack_e68;
        lVar50 = lVar50 + 0x10;
      }
      pDVar45 = (DynamicStackArray<float,_16UL,_64UL> *)((long)local_e50 + 0x340);
      pDVar46 = (DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)((long)local_e20 + 0x340);
    }
    FeatureAdaptiveEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::FeatureAdaptiveEval
              (&local_db0,(CatmullClarkPatch *)&local_d80,*local_df0,*local_de0,local_e40,local_e10,
               local_e00->P,local_e00->dPdu,local_e00->dPdv,local_e00->ddPdudu,local_e00->ddPdvdv,
               local_e00->ddPdudv);
    array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    ~array_t(&local_d80);
LAB_005beb47:
    bVar40 = true;
  }
  return bVar40;
}

Assistant:

bool eval(Ref This, const float& u, const float& v, const float dscale, const size_t depth) 
        {
          if (!This) return false;
          //PRINT(depth);
          //PRINT2(u,v);
          
          switch (This.type()) 
          {
          case Patch::BILINEAR_PATCH: {
            //PRINT("bilinear");
            ((typename Patch::BilinearPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
            PATCH_DEBUG_SUBDIVISION(This,-1,c,c);
            return true;
          }
          case Patch::BSPLINE_PATCH: {
            //PRINT("bspline");
            ((typename Patch::BSplinePatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale);
            PATCH_DEBUG_SUBDIVISION(This,-1,c,-1);
            return true;
          }
          case Patch::BEZIER_PATCH: {
            //PRINT("bezier");
            ((typename Patch::BezierPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale);
            PATCH_DEBUG_SUBDIVISION(This,-1,c,-1);
            return true;
          }
          case Patch::GREGORY_PATCH: {
            //PRINT("gregory");
            ((typename Patch::GregoryPatch*)This.object())->patch.eval(u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale); 
            PATCH_DEBUG_SUBDIVISION(This,-1,-1,c);
            return true;
          }
          case Patch::SUBDIVIDED_QUAD_PATCH: {
            //PRINT("subdivided quad");
            return eval_quad(((typename Patch::SubdividedQuadPatch*)This.object()),u,v,dscale,depth);
          }
          case Patch::SUBDIVIDED_GENERAL_PATCH: { 
            //PRINT("general_patch");
            assert(dscale == 1.0f); 
            return eval_general(((typename Patch::SubdividedGeneralPatch*)This.object()),u,v,depth); 
          }
          case Patch::EVAL_PATCH: { 
            //PRINT("eval_patch");
            CatmullClarkPatch patch; patch.deserialize(This.object());
            FeatureAdaptiveEval<Vertex,Vertex_t>(patch,u,v,dscale,depth,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv);
            return true;
          }
          default: 
            assert(false); 
            return false;
          }
        }